

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddChrpathPatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmGeneratorTarget *this_00;
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  PolicyStatus PVar4;
  cmComputeLinkInformation *this_01;
  cmMakefile *this_02;
  string *psVar5;
  ostream *poVar6;
  cmGlobalGenerator *pcVar7;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  iterator iVar9;
  string *runpath;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  pointer pbVar11;
  long lVar12;
  char *pcVar13;
  WrapQuotes wrapQuotes;
  const_iterator __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  pointer pbVar14;
  long lVar15;
  string_view str;
  string_view str_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ordered;
  int darwin_major_version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newRuntimeDirs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  runpath_change;
  string darwin_major_version_s;
  string installNameTool;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oldRuntimeDirs;
  ostringstream msg;
  cmOutputConverter *local_320;
  istringstream ss;
  cmOutputConverter *local_1a8;
  byte abStack_190 [352];
  
  if (this->ImportLibrary != false) {
    return;
  }
  psVar5 = toDestDirPath;
  bVar2 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
  wrapQuotes = (WrapQuotes)psVar5;
  if (!bVar2) {
    return;
  }
  this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
  if (this_01 == (cmComputeLinkInformation *)0x0) {
    return;
  }
  this_02 = cmTarget::GetMakefile(this->Target->Target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator<char> *)&msg);
  bVar2 = cmMakefile::IsOn(this_02,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if (!bVar2) {
    cmComputeLinkInformation::GetRPathString_abi_cxx11_((string *)&ss,this_01,false);
    cmComputeLinkInformation::GetChrpathString_abi_cxx11_((string *)&msg,this_01);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &msg);
    if (!_Var3) {
      str._M_str = (char *)0x0;
      str._M_len = (size_t)_ss;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)&runpath_change,local_1a8,str,wrapQuotes);
      str_00._M_str = (char *)0x0;
      str_00._M_len = (size_t)_msg;
      cmOutputConverter::EscapeForCMake_abi_cxx11_(&installNameTool,local_320,str_00,wrapQuotes);
      poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar6 = std::operator<<(poVar6,"file(RPATH_CHANGE\n");
      poVar6 = ::operator<<(poVar6,(cmScriptGeneratorIndent)indent.Level);
      poVar6 = std::operator<<(poVar6,"     FILE \"");
      poVar6 = std::operator<<(poVar6,(string *)toDestDirPath);
      poVar6 = std::operator<<(poVar6,"\"\n");
      poVar6 = ::operator<<(poVar6,(cmScriptGeneratorIndent)indent.Level);
      poVar6 = std::operator<<(poVar6,"     OLD_RPATH ");
      poVar6 = std::operator<<(poVar6,(string *)&runpath_change);
      std::operator<<(poVar6,"\n");
      PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0095(this->Target);
      if (PVar4 == OLD) {
LAB_003869e4:
        poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar6 = std::operator<<(poVar6,"     NEW_RPATH \"");
        poVar6 = std::operator<<(poVar6,(string *)&msg);
        std::operator<<(poVar6,"\"");
      }
      else {
        if (PVar4 == WARN) {
          IssueCMP0095Warning(this,(string *)&msg);
          goto LAB_003869e4;
        }
        poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar6 = std::operator<<(poVar6,"     NEW_RPATH ");
        std::operator<<(poVar6,(string *)&installNameTool);
      }
      this_00 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&darwin_major_version_s,"INSTALL_REMOVE_ENVIRONMENT_RPATH",
                 (allocator<char> *)&local_368);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(this_00,&darwin_major_version_s);
      std::__cxx11::string::~string((string *)&darwin_major_version_s);
      if (bVar2) {
        poVar6 = std::operator<<(os,"\n");
        os = ::operator<<(poVar6,(cmScriptGeneratorIndent)indent.Level);
        pcVar13 = "     INSTALL_REMOVE_ENVIRONMENT_RPATH)\n";
      }
      else {
        pcVar13 = ")\n";
      }
      std::operator<<(os,pcVar13);
      std::__cxx11::string::~string((string *)&installNameTool);
      std::__cxx11::string::~string((string *)&runpath_change);
    }
    std::__cxx11::string::~string((string *)&msg);
    psVar5 = (string *)&ss;
    goto LAB_00386ef7;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"CMAKE_INSTALL_NAME_TOOL",(allocator<char> *)&msg);
  psVar5 = cmMakefile::GetSafeDefinition(this_02,(string *)&ss);
  std::__cxx11::string::string((string *)&installNameTool,(string *)psVar5);
  std::__cxx11::string::~string((string *)&ss);
  oldRuntimeDirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  oldRuntimeDirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  oldRuntimeDirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newRuntimeDirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newRuntimeDirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  newRuntimeDirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmComputeLinkInformation::GetRPath(this_01,&oldRuntimeDirs,false);
  cmComputeLinkInformation::GetRPath(this_01,&newRuntimeDirs,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"DARWIN_MAJOR_VERSION",(allocator<char> *)&msg);
  psVar5 = cmMakefile::GetSafeDefinition(this_02,(string *)&ss);
  std::__cxx11::string::string((string *)&darwin_major_version_s,(string *)psVar5);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&ss,(string *)&darwin_major_version_s,_S_in);
  std::istream::operator>>(&ss,&darwin_major_version);
  pbVar14 = oldRuntimeDirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((((abStack_190[*(long *)(_ss + -0x18)] & 5) == 0) && (darwin_major_version < 10)) &&
     ((oldRuntimeDirs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       oldRuntimeDirs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ||
      (pbVar14 = oldRuntimeDirs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      newRuntimeDirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      newRuntimeDirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar6 = std::operator<<((ostream *)&msg,"WARNING: Target \"");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar6 = std::operator<<(poVar6,(string *)psVar5);
    poVar6 = std::operator<<(poVar6,"\" has runtime paths which cannot be changed during install.  "
                            );
    poVar6 = std::operator<<(poVar6,
                             "To change runtime paths, OS X version 10.6 or newer is required.  ");
    poVar6 = std::operator<<(poVar6,
                             "Therefore, runtime paths will not be changed when installing.  ");
    std::operator<<(poVar6,
                    "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around this limitation.");
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this_02,WARNING,(string *)&runpath_change);
    std::__cxx11::string::~string((string *)&runpath_change);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  else {
    runpath_change._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runpath_change._M_t._M_impl.super__Rb_tree_header._M_header;
    runpath_change._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runpath_change._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runpath_change._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ordered.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ordered.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ordered.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    runpath_change._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runpath_change._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pbVar11 = oldRuntimeDirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = newRuntimeDirs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, pbVar11 != pbVar14;
        pbVar11 = pbVar11 + 1) {
      pcVar7 = cmMakefile::GetGlobalGenerator(this_02);
      (*pcVar7->_vptr_cmGlobalGenerator[0x16])(&local_368,pcVar7,pbVar11,config);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[7],_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&msg,&local_368,(char (*) [7])"delete");
      pVar16 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&runpath_change,
                          (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&msg);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&msg);
      std::__cxx11::string::~string((string *)&local_368);
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&ordered,(value_type *)(pVar16.first._M_node._M_node + 1));
      }
    }
    for (pbVar14 = newRuntimeDirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = ordered.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, pbVar14 != pbVar1;
        pbVar14 = pbVar14 + 1) {
      pcVar7 = cmMakefile::GetGlobalGenerator(this_02);
      (*pcVar7->_vptr_cmGlobalGenerator[0x16])(&local_368,pcVar7,pbVar14,config);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[4],_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&msg,&local_368,(char (*) [4])0x65bb4c);
      pVar16 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&runpath_change,
                          (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&msg);
      _Var8 = pVar16.first._M_node;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&msg);
      std::__cxx11::string::~string((string *)&local_368);
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(_Var8._M_node + 2),"add");
        if (bVar2) {
          _Var8._M_node[2]._M_parent = (_Base_ptr)0x0;
          **(undefined1 **)(_Var8._M_node + 2) = 0;
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&ordered,(value_type *)(_Var8._M_node + 1));
      }
    }
    local_368._M_dataplus._M_p = (pointer)&runpath_change;
    lVar15 = (long)ordered.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)ordered.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    __it._M_current =
         ordered.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _msg = local_368._M_dataplus._M_p;
    for (lVar12 = lVar15 >> 7; _Var10._M_current = __it._M_current, 0 < lVar12; lVar12 = lVar12 + -1
        ) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&msg,__it);
      if (bVar2) goto LAB_00386d54;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&msg,__it._M_current + 1);
      _Var10._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_00386d54;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&msg,__it._M_current + 2);
      _Var10._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_00386d54;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&msg,__it._M_current + 3);
      _Var10._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_00386d54;
      __it._M_current = __it._M_current + 4;
      lVar15 = lVar15 + -0x80;
    }
    lVar15 = lVar15 >> 5;
    if (lVar15 == 1) {
LAB_00386f30:
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&msg,__it);
      _Var10._M_current = __it._M_current;
      if (!bVar2) {
        _Var10._M_current = pbVar11;
      }
LAB_00386d54:
      __first._M_current = _Var10._M_current;
      if (_Var10._M_current != pbVar11) {
        while (_Var10._M_current = _Var10._M_current + 1, _Var10._M_current != pbVar11) {
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                                *)&local_368,_Var10);
          if (!bVar2) {
            std::__cxx11::string::operator=
                      ((string *)__first._M_current,(string *)_Var10._M_current);
            __first._M_current = __first._M_current + 1;
          }
        }
      }
    }
    else {
      if (lVar15 == 2) {
LAB_00386f12:
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
                ::operator()((_Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                              *)&msg,__it);
        _Var10._M_current = __it._M_current;
        if (!bVar2) {
          __it._M_current = __it._M_current + 1;
          goto LAB_00386f30;
        }
        goto LAB_00386d54;
      }
      __first._M_current = pbVar11;
      if (lVar15 == 3) {
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
                ::operator()((_Iter_pred<cmInstallTargetGenerator::AddChrpathPatchRule(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                              *)&msg,__it);
        if (!bVar2) {
          __it._M_current = __it._M_current + 1;
          goto LAB_00386f12;
        }
        goto LAB_00386d54;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&ordered,__first,
            (const_iterator)
            ordered.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish);
    if (ordered.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        ordered.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar6 = std::operator<<(poVar6,"execute_process(COMMAND ");
      poVar6 = std::operator<<(poVar6,(string *)&installNameTool);
      std::operator<<(poVar6,"\n");
      pbVar14 = ordered.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar11 = ordered.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar14;
          pbVar11 = pbVar11 + 1) {
        poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar6 = std::operator<<(poVar6,"  -");
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&runpath_change._M_t,pbVar11);
        poVar6 = std::operator<<(poVar6,(string *)(iVar9._M_node + 2));
        poVar6 = std::operator<<(poVar6,"_rpath \"");
        poVar6 = std::operator<<(poVar6,(string *)pbVar11);
        std::operator<<(poVar6,"\"\n");
      }
      poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar6 = std::operator<<(poVar6,"  \"");
      poVar6 = std::operator<<(poVar6,(string *)toDestDirPath);
      std::operator<<(poVar6,"\")\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ordered);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&runpath_change._M_t);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  std::__cxx11::string::~string((string *)&darwin_major_version_s);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&newRuntimeDirs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&oldRuntimeDirs);
  psVar5 = &installNameTool;
LAB_00386ef7:
  std::__cxx11::string::~string((string *)psVar5);
  return;
}

Assistant:

void cmInstallTargetGenerator::AddChrpathPatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  cmMakefile* mf = this->Target->Target->GetMakefile();

  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // If using install_name_tool, set up the rules to modify the rpaths.
    std::string installNameTool =
      mf->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL");

    std::vector<std::string> oldRuntimeDirs;
    std::vector<std::string> newRuntimeDirs;
    cli->GetRPath(oldRuntimeDirs, false);
    cli->GetRPath(newRuntimeDirs, true);

    std::string darwin_major_version_s =
      mf->GetSafeDefinition("DARWIN_MAJOR_VERSION");

    std::istringstream ss(darwin_major_version_s);
    int darwin_major_version;
    ss >> darwin_major_version;
    if (!ss.fail() && darwin_major_version <= 9 &&
        (!oldRuntimeDirs.empty() || !newRuntimeDirs.empty())) {
      std::ostringstream msg;
      msg
        << "WARNING: Target \"" << this->Target->GetName()
        << "\" has runtime paths which cannot be changed during install.  "
        << "To change runtime paths, OS X version 10.6 or newer is required.  "
        << "Therefore, runtime paths will not be changed when installing.  "
        << "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around"
           " this limitation.";
      mf->IssueMessage(MessageType::WARNING, msg.str());
    } else {
      // To be consistent with older versions, runpath changes must be ordered,
      // deleted first, then added, *and* the same path must only appear once.
      std::map<std::string, std::string> runpath_change;
      std::vector<std::string> ordered;
      for (std::string const& dir : oldRuntimeDirs) {
        // Normalize path and add to map of changes to make
        auto iter_inserted = runpath_change.insert(
          { mf->GetGlobalGenerator()->ExpandCFGIntDir(dir, config),
            "delete" });
        if (iter_inserted.second) {
          // Add path to ordered list of changes
          ordered.push_back(iter_inserted.first->first);
        }
      }

      for (std::string const& dir : newRuntimeDirs) {
        // Normalize path and add to map of changes to make
        auto iter_inserted = runpath_change.insert(
          { mf->GetGlobalGenerator()->ExpandCFGIntDir(dir, config), "add" });
        if (iter_inserted.second) {
          // Add path to ordered list of changes
          ordered.push_back(iter_inserted.first->first);
        } else if (iter_inserted.first->second != "add") {
          // Rpath was requested to be deleted and then later re-added. Drop it
          // from the list by marking as an empty value.
          iter_inserted.first->second.clear();
        }
      }

      // Remove rpaths that are unchanged (value was set to empty)
      ordered.erase(
        std::remove_if(ordered.begin(), ordered.end(),
                       [&runpath_change](const std::string& runpath) {
                         return runpath_change.find(runpath)->second.empty();
                       }),
        ordered.end());

      if (!ordered.empty()) {
        os << indent << "execute_process(COMMAND " << installNameTool << "\n";
        for (std::string const& runpath : ordered) {
          // Either 'add_rpath' or 'delete_rpath' since we've removed empty
          // entries
          os << indent << "  -" << runpath_change.find(runpath)->second
             << "_rpath \"" << runpath << "\"\n";
        }
        os << indent << "  \"" << toDestDirPath << "\")\n";
      }
    }
  } else {
    // Construct the original rpath string to be replaced.
    std::string oldRpath = cli->GetRPathString(false);

    // Get the install RPATH from the link information.
    std::string newRpath = cli->GetChrpathString();

    // Skip the rule if the paths are identical
    if (oldRpath == newRpath) {
      return;
    }

    // Escape any CMake syntax in the RPATHs.
    std::string escapedOldRpath = cmOutputConverter::EscapeForCMake(oldRpath);
    std::string escapedNewRpath = cmOutputConverter::EscapeForCMake(newRpath);

    // Write a rule to run chrpath to set the install-tree RPATH
    os << indent << "file(RPATH_CHANGE\n"
       << indent << "     FILE \"" << toDestDirPath << "\"\n"
       << indent << "     OLD_RPATH " << escapedOldRpath << "\n";

    // CMP0095: ``RPATH`` entries are properly escaped in the intermediary
    // CMake install script.
    switch (this->Target->GetPolicyStatusCMP0095()) {
      case cmPolicies::WARN:
        this->IssueCMP0095Warning(newRpath);
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        os << indent << "     NEW_RPATH \"" << newRpath << "\"";
        break;
      default:
        os << indent << "     NEW_RPATH " << escapedNewRpath;
        break;
    }

    if (this->Target->GetPropertyAsBool("INSTALL_REMOVE_ENVIRONMENT_RPATH")) {
      os << "\n" << indent << "     INSTALL_REMOVE_ENVIRONMENT_RPATH)\n";
    } else {
      os << ")\n";
    }
  }
}